

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_pool_init(mu_Context *ctx,mu_PoolItem *items,int len,mu_Id id)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = ctx->frame;
  uVar5 = 0;
  uVar4 = (ulong)(uint)len;
  if (len < 1) {
    uVar4 = uVar5;
  }
  uVar3 = 0xffffffffffffffff;
  uVar6 = (ulong)uVar1;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = items[uVar5].last_update;
    if ((int)uVar2 < (int)uVar6) {
      uVar3 = uVar5;
    }
    uVar3 = uVar3 & 0xffffffff;
    if ((int)uVar2 < (int)uVar6) {
      uVar6 = (ulong)uVar2;
    }
  }
  if (-1 < (int)uVar3) {
    items[uVar3 & 0xffffffff].id = id;
    items[uVar3 & 0xffffffff].last_update = uVar1;
    return (int)uVar3;
  }
  fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
          ,0x162,"n > -1",uVar6,uVar3);
  abort();
}

Assistant:

int mu_pool_init(mu_Context *ctx, mu_PoolItem *items, int len, mu_Id id) {
  int i, n = -1, f = ctx->frame;
  for (i = 0; i < len; i++) {
    if (items[i].last_update < f) {
      f = items[i].last_update;
      n = i;
    }
  }
  expect(n > -1);
  items[n].id = id;
  mu_pool_update(ctx, items, n);
  return n;
}